

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_context_enumerate_devices__null
                    (ma_context *pContext,ma_enum_devices_callback_proc callback,void *pUserData)

{
  undefined1 local_484 [8];
  ma_device_info deviceInfo_1;
  ma_device_info deviceInfo;
  ma_bool32 cbResult;
  void *pUserData_local;
  ma_enum_devices_callback_proc callback_local;
  ma_context *pContext_local;
  
  deviceInfo.maxSampleRate = 1;
  unique0x100001ac = pUserData;
  if (pContext == (ma_context *)0x0) {
    __assert_fail("pContext != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x24bc,
                  "ma_result ma_context_enumerate_devices__null(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  if (callback == (ma_enum_devices_callback_proc)0x0) {
    __assert_fail("callback != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/BombchuLink[P]ORGTerm/miniaudio.h"
                  ,0x24bd,
                  "ma_result ma_context_enumerate_devices__null(ma_context *, ma_enum_devices_callback_proc, void *)"
                 );
  }
  memset(&deviceInfo_1.maxSampleRate,0,0x230);
  ma_strncpy_s(deviceInfo.id.alsa + 0xf8,0x100,"NULL Playback Device",0xffffffffffffffff);
  deviceInfo.maxSampleRate =
       (*callback)(pContext,ma_device_type_playback,(ma_device_info *)&deviceInfo_1.maxSampleRate,
                   stack0xffffffffffffffe0);
  if (deviceInfo.maxSampleRate != 0) {
    memset(local_484,0,0x230);
    ma_strncpy_s(deviceInfo_1.id.alsa + 0xf8,0x100,"NULL Capture Device",0xffffffffffffffff);
    (*callback)(pContext,ma_device_type_capture,(ma_device_info *)local_484,stack0xffffffffffffffe0)
    ;
  }
  return 0;
}

Assistant:

static ma_result ma_context_enumerate_devices__null(ma_context* pContext, ma_enum_devices_callback_proc callback, void* pUserData)
{
    ma_bool32 cbResult = MA_TRUE;

    MA_ASSERT(pContext != NULL);
    MA_ASSERT(callback != NULL);

    /* Playback. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), "NULL Playback Device", (size_t)-1);
        cbResult = callback(pContext, ma_device_type_playback, &deviceInfo, pUserData);
    }

    /* Capture. */
    if (cbResult) {
        ma_device_info deviceInfo;
        MA_ZERO_OBJECT(&deviceInfo);
        ma_strncpy_s(deviceInfo.name, sizeof(deviceInfo.name), "NULL Capture Device", (size_t)-1);
        cbResult = callback(pContext, ma_device_type_capture, &deviceInfo, pUserData);
    }

    return MA_SUCCESS;
}